

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bbr2_probe_bw.cc
# Opt level: O1

void __thiscall
quic::Bbr2ProbeBwMode::EnterProbeRefill(Bbr2ProbeBwMode *this,uint64_t probe_up_rounds,QuicTime now)

{
  Bbr2NetworkModel *pBVar1;
  long lVar2;
  
  if (((this->cycle_).phase == PROBE_DOWN) && ((this->cycle_).has_advanced_max_bw == false)) {
    pBVar1 = (this->super_Bbr2ModeBase).model_;
    lVar2 = (pBVar1->max_bandwidth_filter_).max_bandwidth_[1].bits_per_second_;
    if (lVar2 != 0) {
      (pBVar1->max_bandwidth_filter_).max_bandwidth_[0].bits_per_second_ = lVar2;
      (pBVar1->max_bandwidth_filter_).max_bandwidth_[1].bits_per_second_ = 0;
    }
    (this->cycle_).has_advanced_max_bw = true;
  }
  (this->cycle_).phase = PROBE_REFILL;
  (this->cycle_).rounds_in_phase = 0;
  (this->cycle_).phase_start_time.time_ = now.time_;
  (this->cycle_).is_sample_from_probing = false;
  this->last_cycle_stopped_risky_probe_ = false;
  pBVar1 = (this->super_Bbr2ModeBase).model_;
  (pBVar1->bandwidth_lo_).bits_per_second_ = 0x7fffffffffffffff;
  pBVar1->inflight_lo_ = 0xffffffffffffffff;
  (this->cycle_).probe_up_rounds = probe_up_rounds;
  (this->cycle_).probe_up_acked = 0;
  Bbr2NetworkModel::RestartRound(pBVar1);
  return;
}

Assistant:

void Bbr2ProbeBwMode::EnterProbeRefill(uint64_t probe_up_rounds, QuicTime now) {
  if (cycle_.phase == CyclePhase::PROBE_DOWN) {
    ExitProbeDown();
  }
 /* QUIC_DVLOG(2) << sender_ << " Phase change: " << cycle_.phase << " ==> "
                << CyclePhase::PROBE_REFILL << " after "
                << now - cycle_.phase_start_time << ", or "
                << cycle_.rounds_in_phase
                << " rounds. probe_up_rounds:" << probe_up_rounds << "  @ "
                << now;*/
  cycle_.phase = CyclePhase::PROBE_REFILL;
  cycle_.rounds_in_phase = 0;
  cycle_.phase_start_time = now;
  cycle_.is_sample_from_probing = false;
  last_cycle_stopped_risky_probe_ = false;

  model_->clear_bandwidth_lo();
  model_->clear_inflight_lo();
  cycle_.probe_up_rounds = probe_up_rounds;
  cycle_.probe_up_acked = 0;
  model_->RestartRound();
}